

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,_0,_int> *this,
          SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *other)

{
  long lVar1;
  StorageIndex *pSVar2;
  bool bVar3;
  Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> *pTVar4;
  Index IVar5;
  char *pcVar6;
  Scalar *pSVar7;
  InnerIterator *this_00;
  char *pcVar8;
  int *piVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  int __c;
  int __c_00;
  int __c_01;
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *in_RSI;
  SparseMatrix<double,_0,_int> *in_RDI;
  Index pos;
  InnerIterator it_1;
  StorageIndex j_2;
  StorageIndex tmp;
  Index j_1;
  IndexVector positions;
  StorageIndex count;
  InnerIterator it;
  Index j;
  SparseMatrix<double,_0,_int> dest;
  OtherCopyEval otherCopyEval;
  OtherCopy otherCopy;
  bool needToTranspose;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffffe30;
  unary_evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_double>
  *in_stack_fffffffffffffe38;
  InnerIterator *in_stack_fffffffffffffe40;
  Index in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar12;
  InnerIterator local_140;
  int local_118;
  int local_114;
  long local_110;
  Index local_108;
  int local_ec;
  InnerIterator local_e8;
  long local_c0;
  SparseMatrix<double,_0,_int> local_88;
  char local_40 [24];
  undefined8 local_28;
  non_const_type pSStack_20;
  undefined1 local_11;
  
  local_11 = 1;
  pTVar4 = SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::derived
                     (in_RSI);
  local_28 = *(undefined8 *)pTVar4;
  pSStack_20 = pTVar4->m_matrix;
  internal::evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::evaluator
            ((evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *)
             in_stack_fffffffffffffe30,
             (Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::rows
            ((SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *)
             0x1e5549);
  SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::cols
            ((SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *)
             0x1e5560);
  SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48
             ,(Index)in_stack_fffffffffffffe40);
  SparseMatrix<double,_0,_int>::outerSize(&local_88);
  Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffe30);
  Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffffe40,(PointerArgType)in_stack_fffffffffffffe38,
             (Index)in_stack_fffffffffffffe30,
             (Stride<0,_0> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  DenseBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::setZero
            ((DenseBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *
             )in_stack_fffffffffffffe30);
  local_c0 = 0;
  while( true ) {
    lVar1 = local_c0;
    IVar5 = SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::
            outerSize((SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>
                       *)0x1e5607);
    if (IVar5 <= lVar1) break;
    pcVar8 = local_40;
    internal::
    unary_evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_double>
    ::InnerIterator::InnerIterator
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(Index)in_stack_fffffffffffffe30)
    ;
    while( true ) {
      bVar3 = SparseCompressedBase::InnerIterator::operator_cast_to_bool((InnerIterator *)&local_e8)
      ;
      pSVar2 = local_88.m_outerIndex;
      if (!bVar3) break;
      pcVar6 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::index
                         (&local_e8,pcVar8,__c);
      pSVar2[(int)pcVar6] = pSVar2[(int)pcVar6] + 1;
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::operator++
                (&local_e8);
    }
    local_c0 = local_c0 + 1;
  }
  local_ec = 0;
  local_108 = SparseMatrix<double,_0,_int>::outerSize(&local_88);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<int,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffe40,
             (long *)in_stack_fffffffffffffe38);
  local_110 = 0;
  while( true ) {
    lVar1 = local_110;
    IVar5 = SparseMatrix<double,_0,_int>::outerSize(&local_88);
    iVar12 = local_ec;
    if (IVar5 <= lVar1) break;
    local_114 = local_88.m_outerIndex[local_110];
    local_88.m_outerIndex[local_110] = local_ec;
    pSVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    *pSVar7 = iVar12;
    local_ec = local_114 + local_ec;
    local_110 = local_110 + 1;
  }
  IVar5 = SparseMatrix<double,_0,_int>::outerSize(&local_88);
  local_88.m_outerIndex[IVar5] = iVar12;
  internal::CompressedStorage<double,_int>::resize
            ((CompressedStorage<double,_int> *)CONCAT44(iVar12,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48,(double)in_stack_fffffffffffffe40);
  local_118 = 0;
  while( true ) {
    this_00 = (InnerIterator *)(long)local_118;
    IVar5 = SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::
            outerSize((SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>
                       *)0x1e5879);
    if (IVar5 <= (long)this_00) break;
    pcVar8 = local_40;
    internal::
    unary_evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_double>
    ::InnerIterator::InnerIterator
              (this_00,in_stack_fffffffffffffe38,(Index)in_stack_fffffffffffffe30);
    while( true ) {
      bVar3 = SparseCompressedBase::InnerIterator::operator_cast_to_bool
                        ((InnerIterator *)&local_140);
      if (!bVar3) break;
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::index
                (&local_140,pcVar8,__c_00);
      in_stack_fffffffffffffe38 =
           (unary_evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_double>
            *)DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_fffffffffffffe30,
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      iVar12 = *(int *)in_stack_fffffffffffffe38;
      __c_01 = iVar12 + 1;
      *(int *)in_stack_fffffffffffffe38 = __c_01;
      pcVar8 = (char *)(long)iVar12;
      in_stack_fffffffffffffe2c = local_118;
      piVar9 = (int *)internal::CompressedStorage<double,_int>::index
                                (&local_88.m_data,pcVar8,__c_01);
      *piVar9 = in_stack_fffffffffffffe2c;
      pSVar10 = SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::value
                          (&local_140);
      in_stack_fffffffffffffe30 = (SparseMatrix<double,_0,_int> *)*pSVar10;
      pSVar11 = internal::CompressedStorage<double,_int>::value(&local_88.m_data,(Index)pcVar8);
      *pSVar11 = (Scalar)in_stack_fffffffffffffe30;
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::operator++
                (&local_140);
    }
    local_118 = local_118 + 1;
  }
  SparseMatrix<double,_0,_int>::swap
            (in_stack_fffffffffffffe30,
             (SparseMatrix<double,_0,_int> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)0x1e59b8);
  SparseMatrix<double,_0,_int>::~SparseMatrix(in_stack_fffffffffffffe30);
  internal::evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>::~evaluator
            ((evaluator<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_> *)0x1e59d2);
  return in_RDI;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_StorageIndex>& SparseMatrix<Scalar,_Options,_StorageIndex>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)

  #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
    EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
  #endif
      
  const bool needToTranspose = (Flags & RowMajorBit) != (internal::evaluator<OtherDerived>::Flags & RowMajorBit);
  if (needToTranspose)
  {
    #ifdef EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
      EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
    #endif
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested_eval<OtherDerived,2,typename internal::plain_matrix_type<OtherDerived>::type >::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    typedef internal::evaluator<_OtherCopy> OtherCopyEval;
    OtherCopy otherCopy(other.derived());
    OtherCopyEval otherCopyEval(otherCopy);

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<IndexVector> (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    StorageIndex count = 0;
    IndexVector positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      StorageIndex tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (StorageIndex j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
    {
      initAssignment(other.derived());
    }
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}